

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::TrendGroup> * metaf::TrendGroup::fromTrendTime(string *s)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  TrendGroup result;
  optional<metaf::MetafTime> time;
  smatch match;
  TrendGroup *in_stack_fffffffffffffeb8;
  undefined5 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec5;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  string local_118 [12];
  flag_type in_stack_fffffffffffffef4;
  char *in_stack_fffffffffffffef8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff00;
  string local_f8 [8];
  string *in_stack_ffffffffffffff10;
  string local_d8 [32];
  undefined4 local_b8;
  undefined8 local_ac;
  undefined8 local_a4;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_84;
  undefined8 local_7c;
  undefined4 local_74;
  string local_70 [32];
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined4 local_3c;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_38;
  
  __s = in_RDI;
  if (fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') {
    iVar5 = __cxa_guard_acquire(&fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_);
    if (iVar5 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_);
    }
  }
  this = &local_38;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffec7,
                              CONCAT16(in_stack_fffffffffffffec6,
                                       CONCAT15(in_stack_fffffffffffffec5,in_stack_fffffffffffffec0)
                                      )));
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (__s,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)in_RDI,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                     (match_flag_type)((ulong)this >> 0x20));
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(this,CONCAT17(in_stack_fffffffffffffec7,
                        CONCAT16(in_stack_fffffffffffffec6,
                                 CONCAT15(in_stack_fffffffffffffec5,in_stack_fffffffffffffec0))));
    MetafTime::fromStringDDHHMM(in_stack_ffffffffffffff10);
    std::__cxx11::string::~string(local_70);
    bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x23f851);
    if (bVar1) {
      TrendGroup((TrendGroup *)
                 CONCAT17(in_stack_fffffffffffffec7,
                          CONCAT16(in_stack_fffffffffffffec6,
                                   CONCAT15(in_stack_fffffffffffffec5,in_stack_fffffffffffffec0))));
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(this,CONCAT17(in_stack_fffffffffffffec7,
                          CONCAT16(in_stack_fffffffffffffec6,
                                   CONCAT15(in_stack_fffffffffffffec5,in_stack_fffffffffffffec0))));
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffec7,
                                       CONCAT16(in_stack_fffffffffffffec6,
                                                CONCAT15(in_stack_fffffffffffffec5,
                                                         in_stack_fffffffffffffec0))),
                              (char *)in_stack_fffffffffffffeb8);
      std::__cxx11::string::~string(local_d8);
      if ((bVar2 & 1) == 0) {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(this,CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffec6,
                                           CONCAT15(in_stack_fffffffffffffec5,
                                                    in_stack_fffffffffffffec0))));
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffec6,
                                                         CONCAT15(in_stack_fffffffffffffec5,
                                                                  in_stack_fffffffffffffec0))),
                                (char *)in_stack_fffffffffffffeb8);
        std::__cxx11::string::~string(local_f8);
        if ((bVar3 & 1) == 0) {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(this,CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(in_stack_fffffffffffffec5,
                                                            in_stack_fffffffffffffec0))));
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(
                                                  in_stack_fffffffffffffec5,
                                                  in_stack_fffffffffffffec0))),
                                  (char *)in_stack_fffffffffffffeb8);
          std::__cxx11::string::~string(local_118);
          if ((bVar4 & 1) == 0) {
            memcpy(in_RDI,&fromTrendTime::notRecognised,0x4c);
          }
          else {
            local_b8 = 6;
            local_84 = local_50;
            local_7c = local_48;
            local_74 = local_40;
            std::optional<metaf::TrendGroup>::optional<metaf::TrendGroup,_true>
                      ((optional<metaf::TrendGroup> *)
                       CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(bVar4,in_stack_fffffffffffffec0))),
                       in_stack_fffffffffffffeb8);
          }
        }
        else {
          local_b8 = 5;
          local_98 = local_50;
          local_90 = local_48;
          local_88 = local_40;
          std::optional<metaf::TrendGroup>::optional<metaf::TrendGroup,_true>
                    ((optional<metaf::TrendGroup> *)
                     CONCAT17(bVar2,CONCAT16(bVar3,CONCAT15(in_stack_fffffffffffffec5,
                                                            in_stack_fffffffffffffec0))),
                     in_stack_fffffffffffffeb8);
        }
      }
      else {
        local_b8 = 4;
        local_ac = local_50;
        local_a4 = local_48;
        local_9c = local_40;
        std::optional<metaf::TrendGroup>::optional<metaf::TrendGroup,_true>
                  ((optional<metaf::TrendGroup> *)
                   CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffec6,
                                           CONCAT15(in_stack_fffffffffffffec5,
                                                    in_stack_fffffffffffffec0))),
                   in_stack_fffffffffffffeb8);
      }
    }
    else {
      memcpy(in_RDI,&fromTrendTime::notRecognised,0x4c);
    }
  }
  else {
    memcpy(in_RDI,&fromTrendTime::notRecognised,0x4c);
  }
  local_3c = 1;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x23fab0);
  return (optional<metaf::TrendGroup> *)__s;
}

Assistant:

std::optional<TrendGroup> TrendGroup::fromTrendTime(const std::string & s) {
	static const std::optional<TrendGroup> notRecognised;
	static const std::regex rgx("([FTA][MLT])(\\d\\d\\d\\d)");
	static const auto matchType = 1, matchTime = 2;
	std::smatch match;
	if (!regex_match(s, match, rgx)) return notRecognised;
	const auto time = MetafTime::fromStringDDHHMM(match.str(matchTime));
	if (!time.has_value()) return notRecognised;
	TrendGroup result;
	if (match.str(matchType) == "FM") {
		result.t = Type::FROM;
		result.tFrom = time;
		return result;
	}
	if (match.str(matchType) == "TL") {
		result.t = Type::UNTIL;
		result.tTill = time;
		return result;
	}
	if (match.str(matchType) == "AT") {
		result.t = Type::AT;
		result.tAt = time;
		return result;
	}
	return notRecognised;
}